

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O0

void __thiscall
ExprVisitorTest_VisitNotAllDiff_Test::TestBody(ExprVisitorTest_VisitNotAllDiff_Test *this)

{
  Reference other;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
  other_00;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> other_01;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> other_02;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> other_03;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
  value;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> value_00;
  bool bVar1;
  MockSpec<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>)>
  *this_00;
  MockUnhandledVisitor *this_01;
  long in_RDI;
  PairwiseExprBuilder PVar2;
  StrictMock<MockUnhandledVisitor> visitor;
  UnsupportedError *e_1;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  LogicalExpr base;
  PairwiseExpr e;
  PairwiseExprBuilder builder;
  BasicExprVisitor<MockUnhandledVisitor,_TestResult,_mp::internal::ExprTypes> *in_stack_000003f8;
  ExprBase in_stack_00000400;
  Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *in_stack_fffffffffffffd28;
  MockVisitor *in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd38;
  Kind in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  Kind in_stack_fffffffffffffd44;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  ExprBase in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  Type in_stack_fffffffffffffd5c;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  CStringRef in_stack_fffffffffffffd68;
  Kind in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 uVar3;
  Message *message;
  char *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  MockSpec<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>)>
  *in_stack_fffffffffffffe40;
  BasicCStringRef<char> local_e8;
  string local_e0 [32];
  AssertionResult local_c0;
  undefined8 local_a8;
  Impl *local_98;
  undefined8 local_90;
  BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69> local_78;
  Message local_70 [3];
  Impl *local_58;
  undefined8 uStack_50;
  Impl *local_40;
  undefined8 local_38;
  Impl *local_28;
  int local_20;
  Impl *local_18;
  int iStack_10;
  undefined4 uStack_c;
  
  PVar2 = mp::BasicExprFactory<std::allocator<char>_>::BeginPairwise
                    ((BasicExprFactory<std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38);
  local_28 = PVar2.impl_;
  local_20 = PVar2.arg_index_;
  local_38 = *(undefined8 *)(in_RDI + 0x1cc0);
  other.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffd44;
  other.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd40;
  local_18 = local_28;
  iStack_10 = local_20;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),other,
             (type_conflict)((ulong)in_stack_fffffffffffffd30 >> 0x20));
  mp::BasicExprFactory<std::allocator<char>_>::
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
  ::AddArg((BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
            *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
           (Arg)in_stack_fffffffffffffd50.impl_);
  uStack_50 = CONCAT44(uStack_c,iStack_10);
  local_58 = local_18;
  PVar2.impl_._4_4_ = in_stack_fffffffffffffd44;
  PVar2.impl_._0_4_ = in_stack_fffffffffffffd40;
  PVar2.arg_index_ = in_stack_fffffffffffffd48;
  PVar2._12_4_ = in_stack_fffffffffffffd4c;
  local_78.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::EndPairwise
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),PVar2);
  message = local_70;
  value.super_BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffd74;
  value.super_BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd70;
  local_40 = (Impl *)local_78.super_ExprBase.impl_;
  testing::
  Matcher<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
  ::Matcher((Matcher<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
             *)in_stack_fffffffffffffd68.data_,value);
  this_00 = MockVisitor::gmock_VisitNotAllDiff
                      (in_stack_fffffffffffffd30,
                       (Matcher<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
                        *)in_stack_fffffffffffffd28);
  testing::internal::
  MockSpec<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>)>
  ::InternalExpectedAt
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
             in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  testing::
  Matcher<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
  ::~Matcher((Matcher<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
              *)0x149295);
  local_98 = local_40;
  uVar3 = 0;
  other_00.super_BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffd44;
  other_00.super_BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd40;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),other_00,
             (type_conflict)((ulong)in_stack_fffffffffffffd30 >> 0x20));
  local_a8 = local_90;
  other_01.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd44;
  other_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd40;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),other_01,
             (type_conflict)((ulong)in_stack_fffffffffffffd30 >> 0x20));
  mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)in_stack_000003f8
             ,(Expr)in_stack_00000400.impl_);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (bVar1) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_e8,"unsupported: {}");
    in_stack_fffffffffffffd70 = mp::internal::ExprBase::kind((ExprBase *)0x14935b);
    in_stack_fffffffffffffd68.data_ = mp::expr::str(in_stack_fffffffffffffd44);
    fmt::format<char_const*>
              (in_stack_fffffffffffffd68,
               (char **)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    in_stack_fffffffffffffd67 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffd67) {
      testing::StrictMock<NullVisitor>::StrictMock
                ((StrictMock<NullVisitor> *)
                 CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
      other_02.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd44;
      other_02.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd40;
      mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),other_02,
                 (type_conflict)((ulong)in_stack_fffffffffffffd30 >> 0x20));
      mp::BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                ((BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes> *)
                 in_stack_000003f8,(Expr)in_stack_00000400.impl_);
      testing::StrictMock<NullVisitor>::~StrictMock
                ((StrictMock<NullVisitor> *)in_stack_fffffffffffffd30);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (char (*) [127])CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    std::__cxx11::string::~string(local_e0);
  }
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  this_01 = (MockUnhandledVisitor *)
            testing::AssertionResult::failure_message((AssertionResult *)0x1496f1);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
             in_stack_fffffffffffffd5c,(char *)in_stack_fffffffffffffd50.impl_,
             in_stack_fffffffffffffd4c,
             (char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  testing::internal::AssertHelper::operator=((AssertHelper *)this_00,message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
  testing::Message::~Message((Message *)0x14974e);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1497a6);
  testing::StrictMock<MockUnhandledVisitor>::StrictMock
            ((StrictMock<MockUnhandledVisitor> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  value_00.super_ExprBase.impl_._4_4_ = uVar3;
  value_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd70;
  testing::Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::Matcher
            ((Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)
             in_stack_fffffffffffffd68.data_,value_00);
  MockUnhandledVisitor::gmock_VisitLogical(this_01,in_stack_fffffffffffffd28);
  testing::internal::MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)>::
  InternalExpectedAt((MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)> *
                     )in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                     in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  testing::Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::~Matcher
            ((Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)0x149827);
  other_03.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd44;
  other_03.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd40;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),other_03,
             (type_conflict)((ulong)this_01 >> 0x20));
  mp::BasicExprVisitor<MockUnhandledVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            (in_stack_000003f8,(Expr)in_stack_00000400.impl_);
  testing::StrictMock<MockUnhandledVisitor>::~StrictMock
            ((StrictMock<MockUnhandledVisitor> *)this_01);
  return;
}

Assistant:

TEST_F(ExprVisitorTest, VisitStringLiteral) {
  auto e = factory_.MakeStringLiteral("foo");
  EXPECT_CALL(visitor_, VisitStringLiteral(e));
  mp::Expr base = e;
  visitor_.Visit(base);
  TEST_UNHANDLED(base);
}